

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O3

void leccalc::loadoccurrence
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,int *totalperiods)

{
  long lVar1;
  float fVar2;
  long *plVar3;
  FILE *__stream;
  size_t sVar4;
  mapped_type *pmVar5;
  long *in_RCX;
  char *pcVar6;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *extraout_RDX;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  uint in_R8D;
  aggreports *in_R9;
  int *piVar10;
  char *pcVar11;
  bool bVar12;
  int date_opts;
  occurrence occ;
  key_type kStack_bc;
  uint uStack_b0;
  int iStack_ac;
  float fStack_a8;
  int iStack_a4;
  int aiStack_a0 [2];
  long *plStack_98;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Stack_90;
  char *pcStack_88;
  char *pcStack_80;
  ulong uStack_78;
  int *piStack_70;
  uint local_34;
  occurrence_granular local_30;
  
  pcVar9 = "input/occurrence.bin";
  pcVar8 = "rb";
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    local_34 = 0;
    fread(&local_34,4,1,__stream);
    fread(totalperiods,4,1,__stream);
    if (local_34 < 2) {
      loadoccurrence<occurrence>(event_to_periods,(occurrence *)&local_30,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular>(event_to_periods,&local_30,(FILE *)__stream);
    }
    fclose(__stream);
    return;
  }
  loadoccurrence();
  plStack_98 = in_RCX;
  p_Stack_90 = extraout_RDX;
  checkinputfile((uint *)pcVar9,(FILE *)_stdin,in_R9);
  pcVar9 = pcVar8 + 8;
  uStack_b0 = in_R8D ^ 1;
  pcStack_88 = pcVar9;
  pcStack_80 = pcVar8;
  uVar7 = uStack_b0;
  do {
    sVar4 = fread(&iStack_a4,0xc,1,_stdin);
    if (sVar4 != 1) {
      return;
    }
    pcVar6 = *(char **)(pcVar8 + 0x10);
    pcVar11 = pcVar9;
    if (pcVar6 == (char *)0x0) {
LAB_00102cdd:
      do {
        sVar4 = fread(&kStack_bc,8,1,_stdin);
        if (sVar4 != 1) break;
      } while (kStack_bc.summary_id != 0);
    }
    else {
      do {
        if (iStack_a4 <= *(int *)(pcVar6 + 0x20)) {
          pcVar11 = pcVar6;
        }
        pcVar6 = *(char **)(pcVar6 + (ulong)(*(int *)(pcVar6 + 0x20) < iStack_a4) * 8 + 0x10);
      } while (pcVar6 != (char *)0x0);
      if ((pcVar11 == pcVar9) || (iStack_a4 < *(int *)(pcVar11 + 0x20))) goto LAB_00102cdd;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(p_Stack_90,aiStack_a0);
      while (sVar4 = fread(&iStack_ac,8,1,_stdin), fVar2 = fStack_a8, sVar4 == 1) {
        if (iStack_ac == 0) {
          sVar4 = 1;
          break;
        }
        if ((1 < iStack_ac + 5U) && ((fStack_a8 <= 0.0 & (byte)uVar7) == 0)) {
          kStack_bc.summary_id = aiStack_a0[0];
          kStack_bc.sidx = iStack_ac;
          piVar10 = *(int **)(pcVar11 + 0x28);
          piStack_70 = *(int **)(pcVar11 + 0x30);
          pcVar9 = pcStack_88;
          pcVar8 = pcStack_80;
          uVar7 = uStack_b0;
          if (piVar10 != piStack_70) {
            bVar12 = iStack_ac != -1;
            uStack_78 = (ulong)bVar12;
            do {
              plVar3 = plStack_98;
              kStack_bc.period_no = *piVar10;
              lVar1 = (ulong)bVar12 * 0x30;
              pmVar5 = std::
                       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                       ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                     *)(*plStack_98 + lVar1),&kStack_bc);
              pmVar5->agg_out_loss = pmVar5->agg_out_loss + fVar2;
              pmVar5 = std::
                       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                       ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                     *)(lVar1 + *plVar3),&kStack_bc);
              if (pmVar5->max_out_loss <= fVar2 && fVar2 != pmVar5->max_out_loss) {
                pmVar5 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                       *)((ulong)(uint)((int)uStack_78 * 0x30) + *plStack_98),
                                      &kStack_bc);
                pmVar5->max_out_loss = fVar2;
              }
              piVar10 = piVar10 + 1;
              pcVar9 = pcStack_88;
              pcVar8 = pcStack_80;
              uVar7 = uStack_b0;
            } while (piVar10 != piStack_70);
          }
        }
      }
    }
    if (sVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    int& totalperiods)
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Error reading file %s\n",
				OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		fread(&totalperiods, sizeof(totalperiods), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			loadoccurrence(event_to_periods, occ, fin);
		} else {
			occurrence occ;
			loadoccurrence(event_to_periods, occ, fin);
		}

		fclose(fin);
	}